

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::InstrumentPass::GenReadFunctionCall
          (InstrumentPass *this,uint32_t return_id,uint32_t func_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *func_call_args,
          InstructionBuilder *ref_builder)

{
  __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> _Var1;
  long lVar2;
  iterator instr;
  bool bVar3;
  uint32_t uVar4;
  mapped_type *pmVar5;
  Instruction *this_00;
  InstructionBuilder builder;
  InstructionBuilder local_50;
  
  if (this->opt_direct_reads_ == true) {
    pmVar5 = std::__detail::
             _Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_spvtools::opt::InstrumentPass::vector_hash_,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_spvtools::opt::InstrumentPass::vector_hash_,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->call2id_,func_call_args);
    if (*pmVar5 != 0) {
      return *pmVar5;
    }
  }
  InstructionBuilder::InstructionBuilder
            (&local_50,ref_builder->context_,(ref_builder->insert_before_).super_iterator.node_,
             ref_builder->preserved_analyses_);
  if (this->opt_direct_reads_ == true) {
    bVar3 = AllConstant(this,func_call_args);
  }
  else {
    bVar3 = false;
  }
  if (bVar3 != false) {
    _Var1._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
         (((this->curr_func_->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t;
    lVar2 = *(long *)((long)_Var1._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl
                     + 0x20);
    if ((lVar2 == 0) || (*(char *)(lVar2 + 0x18) != '\0')) {
      __assert_fail("!insts_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                    ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
    }
    instr.node_ = *(Instruction **)
                   ((long)_Var1._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl +
                   0x28);
    local_50.parent_ = IRContext::get_instr_block(local_50.context_,instr.node_);
    local_50.insert_before_.super_iterator.node_ = (iterator)(iterator)instr.node_;
  }
  this_00 = InstructionBuilder::AddFunctionCall(&local_50,return_id,func_id,func_call_args);
  uVar4 = 0;
  if (this_00->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
  }
  if (bVar3 != false) {
    pmVar5 = std::__detail::
             _Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_spvtools::opt::InstrumentPass::vector_hash_,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_spvtools::opt::InstrumentPass::vector_hash_,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->call2id_,func_call_args);
    *pmVar5 = uVar4;
  }
  return uVar4;
}

Assistant:

uint32_t InstrumentPass::GenReadFunctionCall(
    uint32_t return_id, uint32_t func_id,
    const std::vector<uint32_t>& func_call_args,
    InstructionBuilder* ref_builder) {
  // If optimizing direct reads and the call has already been generated,
  // use its result
  if (opt_direct_reads_) {
    uint32_t res_id = call2id_[func_call_args];
    if (res_id != 0) return res_id;
  }
  // If the function arguments are all constants, the call can be moved to the
  // first block of the function where its result can be reused. One example
  // where this is profitable is for uniform buffer references, of which there
  // are often many.
  InstructionBuilder builder(ref_builder->GetContext(),
                             &*ref_builder->GetInsertPoint(),
                             ref_builder->GetPreservedAnalysis());
  bool insert_in_first_block = opt_direct_reads_ && AllConstant(func_call_args);
  if (insert_in_first_block) {
    Instruction* insert_before = &*curr_func_->begin()->tail();
    builder.SetInsertPoint(insert_before);
  }
  uint32_t res_id =
      builder.AddFunctionCall(return_id, func_id, func_call_args)->result_id();
  if (insert_in_first_block) call2id_[func_call_args] = res_id;
  return res_id;
}